

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

string * __thiscall
Parse::toCatName_abi_cxx11_(string *__return_storage_ptr__,Parse *this,Category cat)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (cat == FUNCTION) {
    pcVar2 = "func";
    paVar1 = &local_b;
  }
  else if (cat == FORMALPARAM) {
    pcVar2 = "vf";
    paVar1 = &local_a;
  }
  else if (cat == VARIABLE) {
    pcVar2 = "var";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "const";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string Parse::toCatName(Category cat) {
    if(cat == Category::VARIABLE) {
        return "var";
    } else if(cat == Category::FORMALPARAM) {
        return "vf";
    } else if(cat == Category::FUNCTION) {
        return "func";
    } else if(cat == Category::CONST) {
        return "const";
    }
}